

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
int_writer<int,_fmt::v5::basic_format_specs<char>_>::int_writer
          (int_writer<int,_fmt::v5::basic_format_specs<char>_> *this,
          basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *w,
          int value,basic_format_specs<char> *s)

{
  type_conflict1 tVar1;
  bool bVar2;
  undefined8 in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined1 local_29;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RCX;
  *(int *)(in_RDI + 2) = in_EDX;
  *(undefined4 *)(in_RDI + 3) = 0;
  tVar1 = internal::is_negative<int>(in_EDX);
  if (tVar1) {
    *(undefined1 *)((long)in_RDI + 0x14) = 0x2d;
    *(int *)(in_RDI + 3) = *(int *)(in_RDI + 3) + 1;
    *(int *)(in_RDI + 2) = -*(int *)(in_RDI + 2);
  }
  else {
    bVar2 = core_format_specs::has((core_format_specs *)(in_RDI[1] + 0xc),1);
    if (bVar2) {
      bVar2 = core_format_specs::has((core_format_specs *)(in_RDI[1] + 0xc),2);
      local_29 = 0x2b;
      if (!bVar2) {
        local_29 = 0x20;
      }
      *(undefined1 *)((long)in_RDI + 0x14) = local_29;
      *(int *)(in_RDI + 3) = *(int *)(in_RDI + 3) + 1;
    }
  }
  return;
}

Assistant:

int_writer(basic_writer<Range> &w, Int value, const Spec &s)
      : writer(w), spec(s), abs_value(static_cast<unsigned_type>(value)),
        prefix_size(0) {
      if (internal::is_negative(value)) {
        prefix[0] = '-';
        ++prefix_size;
        abs_value = 0 - abs_value;
      } else if (spec.has(SIGN_FLAG)) {
        prefix[0] = spec.has(PLUS_FLAG) ? '+' : ' ';
        ++prefix_size;
      }
    }